

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O1

bool __thiscall GameBoard::containsAnXorAnO(GameBoard *this,Field *field)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  QArrayData *local_48;
  QChar *local_40;
  longlong local_38;
  QArrayData *local_30;
  QChar *local_28;
  longlong local_20;
  
  QAbstractButton::text();
  if (local_28 == (QChar *)0x0) {
    local_28 = (QChar *)&QString::_empty;
  }
  iVar1 = QString::compare_helper(local_28,local_20,"X",-1,CaseSensitive);
  if (iVar1 == 0) {
    bVar3 = true;
  }
  else {
    QAbstractButton::text();
    if (local_40 == (QChar *)0x0) {
      local_40 = (QChar *)&QString::_empty;
    }
    iVar2 = QString::compare_helper(local_40,local_38,"O",-1,CaseSensitive);
    bVar3 = iVar2 == 0;
  }
  if ((iVar1 != 0) && (local_48 != (QArrayData *)0x0)) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  if (local_30 != (QArrayData *)0x0) {
    LOCK();
    (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_30,2,8);
    }
  }
  return bVar3;
}

Assistant:

bool GameBoard::containsAnXorAnO(Field *field)
{
    return field->text() == "X" || field->text() == "O";
}